

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

int non_temporal_setup(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,size_t key_size)

{
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
  *p_Var1;
  int iVar2;
  size_t capacity;
  ptls_fusion_aesgcm_context_t *ppVar3;
  code *pcVar4;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
  *p_Var5;
  uint uVar6;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
  *p_Var7;
  bool bVar8;
  undefined1 auVar9 [16];
  
  iVar2 = ptls_fusion_can_aesni256;
  ppVar3 = (ptls_fusion_aesgcm_context_t *)(ulong)(uint)ptls_fusion_can_aesni256;
  bVar8 = ptls_fusion_can_aesni256 != 0;
  uVar6 = (uint)iv & 0xfff;
  if ((uVar6 < 0xff1) || (0xff4 < uVar6)) {
    auVar9 = *iv;
  }
  else {
    auVar9 = vpshufb_avx(*(undefined1 (*) [16])((ulong)iv & 0xfffffffffffffff0),
                         *(undefined1 (*) [16])("" + ((uint)iv & 0xf)));
  }
  auVar9 = vpshufb_avx(auVar9,_DAT_0012dd60);
  _ctx[1].do_get_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar9._0_8_;
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar9._8_8_;
  if (key != (void *)0x0) {
    pcVar4 = non_temporal_encrypt_v128;
    if (iVar2 != 0) {
      pcVar4 = non_temporal_encrypt_v256;
    }
    capacity = 0xe0;
    if (iVar2 == 0) {
      capacity = 0x70;
    }
    p_Var5 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
              *)0x0;
    _ctx->dispose_crypto = aesgcm_dispose_crypto;
    _ctx->do_get_iv = aesgcm_get_iv;
    _ctx->do_set_iv = aesgcm_set_iv;
    p_Var1 = ptls_aead__do_encrypt;
    if (is_enc == 0) {
      pcVar4 = p_Var5;
      p_Var1 = p_Var5;
    }
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    p_Var7 = non_temporal_decrypt128;
    if (is_enc != 0) {
      p_Var7 = p_Var5;
    }
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_encrypt = p_Var1;
    _ctx->do_encrypt_v = pcVar4;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
          *)p_Var7;
    ppVar3 = new_aesgcm(key,key_size,capacity,(uint)(is_enc != 0 && bVar8));
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar3;
  }
  return (int)ppVar3;
}

Assistant:

static int non_temporal_setup(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv, size_t key_size)
{
    struct aesgcm_context *ctx = (struct aesgcm_context *)_ctx;
    int aesni256 = is_enc && ptls_fusion_can_aesni256;

    ctx->static_iv = loadn128(iv, PTLS_AESGCM_IV_SIZE);
    ctx->static_iv = _mm_shuffle_epi8(ctx->static_iv, byteswap128);
    if (key == NULL)
        return 0;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    ctx->super.do_get_iv = aesgcm_get_iv;
    ctx->super.do_set_iv = aesgcm_set_iv;
    ctx->super.do_encrypt_init = NULL;
    ctx->super.do_encrypt_update = NULL;
    ctx->super.do_encrypt_final = NULL;
    if (is_enc) {
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = aesni256 ? non_temporal_encrypt_v256 : non_temporal_encrypt_v128;
        ctx->super.do_decrypt = NULL;
    } else {
        assert(!aesni256);
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = non_temporal_decrypt128;
    }

    ctx->aesgcm =
        new_aesgcm(key, key_size,
                   7 * (ptls_fusion_can_aesni256 ? 32 : 16), // 6 blocks at once, plus len(A) | len(C) that we might append
                   aesni256);

    return 0;
}